

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
NextLetConstGlobal(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                   *this,int *index,RootObjectBase *instance,PropertyRecord **propertyRecord,
                  Var *value,bool *isConst)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar4;
  PropertyRecord **ppPVar5;
  Var pvVar6;
  bool bVar7;
  int index_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  
  index_00 = *index;
  this_00 = (this->propertyMap).ptr;
  iVar3 = this_00->count - this_00->freeCount;
  bVar7 = index_00 < iVar3;
  if (index_00 < iVar3) {
    do {
      pSVar4 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,index_00);
      bVar1 = pSVar4->Attributes;
      if ((bVar1 & 0x10) != 0) {
        uVar2 = pSVar4->propertyIndex;
        ppPVar5 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,*index);
        *propertyRecord = *ppPVar5;
        pvVar6 = DynamicObject::GetSlot(&instance->super_DynamicObject,(uint)uVar2);
        *value = pvVar6;
        *isConst = (bool)(bVar1 >> 7);
        *index = *index + 1;
        return bVar7;
      }
      index_00 = *index + 1;
      *index = index_00;
      this_00 = (this->propertyMap).ptr;
      iVar3 = this_00->count - this_00->freeCount;
      bVar7 = index_00 < iVar3;
    } while (index_00 < iVar3);
  }
  return bVar7;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::NextLetConstGlobal(int& index, RootObjectBase* instance, const PropertyRecord** propertyRecord, Var* value, bool* isConst)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        for (; index < propertyMap->Count(); index++)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor = propertyMap->GetValueAt(index);

            if (descriptor.Attributes & PropertyLetConstGlobal)
            {
                *propertyRecord = TMapKey_ConvertKey<const PropertyRecord*>(scriptContext, propertyMap->GetKeyAt(index));
                *value = instance->GetSlot(descriptor.propertyIndex);
                *isConst = (descriptor.Attributes & PropertyConst) != 0;

                index += 1;

                return true;
            }
        }

        return false;
    }